

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandMulti(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  Abc_Ntk_t *pAVar3;
  char *pcVar4;
  int iVar5;
  uint fFactor;
  char *pcVar6;
  uint fMulti;
  uint local_50;
  uint local_4c;
  uint local_48;
  uint local_44;
  
  pAVar3 = Abc_FrameReadNtk(pAbc);
  local_44 = 0;
  Extra_UtilGetoptReset();
  local_50 = 0x14;
  fMulti = 1;
  local_4c = 1;
  local_48 = 0;
  fFactor = 0;
LAB_0021fe56:
  do {
    while (iVar1 = Extra_UtilGetopt(argc,argv,"TFmcsfh"), iVar5 = globalUtilOptind, iVar1 == 0x66) {
      fFactor = fFactor ^ 1;
    }
    if (iVar1 == -1) {
      if (pAVar3 == (Abc_Ntk_t *)0x0) {
        pcVar4 = "Empty network.\n";
      }
      else if (pAVar3->ntkType == ABC_NTK_STRASH) {
        pAVar3 = Abc_NtkMulti(pAVar3,local_4c,local_50,local_44,fMulti,local_48,fFactor);
        if (pAVar3 != (Abc_Ntk_t *)0x0) {
          Abc_FrameReplaceCurrentNetwork(pAbc,pAVar3);
          return 0;
        }
        pcVar4 = "Renoding has failed.\n";
      }
      else {
        pcVar4 = "Cannot renode a network that is not an AIG (run \"strash\").\n";
      }
      iVar5 = -1;
      goto LAB_002200a5;
    }
    if (iVar1 == 0x46) {
      if (argc <= globalUtilOptind) {
        pcVar4 = "Command line switch \"-F\" should be followed by an integer.\n";
LAB_0021ff97:
        Abc_Print(-1,pcVar4);
        goto LAB_0021ffa1;
      }
      uVar2 = atoi(argv[globalUtilOptind]);
      local_50 = uVar2;
    }
    else {
      if (iVar1 == 0x73) {
        local_48 = local_48 ^ 1;
        goto LAB_0021fe56;
      }
      if (iVar1 == 99) {
        local_44 = local_44 ^ 1;
        goto LAB_0021fe56;
      }
      if (iVar1 == 0x6d) {
        fMulti = fMulti ^ 1;
        goto LAB_0021fe56;
      }
      if (iVar1 != 0x54) goto LAB_0021ffa1;
      if (argc <= globalUtilOptind) {
        pcVar4 = "Command line switch \"-T\" should be followed by an integer.\n";
        goto LAB_0021ff97;
      }
      uVar2 = atoi(argv[globalUtilOptind]);
      local_4c = uVar2;
    }
    globalUtilOptind = iVar5 + 1;
    if ((int)uVar2 < 0) {
LAB_0021ffa1:
      iVar5 = -2;
      Abc_Print(-2,"usage: multi [-TF <num>] [-msfch]\n");
      Abc_Print(-2,"\t          transforms an AIG into a logic network by creating larger nodes\n");
      Abc_Print(-2,"\t-F <num>: the maximum fanin size after renoding [default = %d]\n",
                (ulong)local_50);
      Abc_Print(-2,"\t-T <num>: the threshold for AIG node duplication [default = %d]\n",
                (ulong)local_4c);
      Abc_Print(-2,"\t          (an AIG node is the root of a new node after renoding\n");
      Abc_Print(-2,"\t          if this leads to duplication of no more than %d AIG nodes,\n",
                (ulong)local_4c);
      Abc_Print(-2,"\t          that is, if [(numFanouts(Node)-1) * size(MFFC(Node))] <= %d)\n",
                (ulong)local_4c);
      pcVar6 = "yes";
      pcVar4 = "yes";
      if (fMulti == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-m      : creates multi-input AND graph [default = %s]\n",pcVar4);
      pcVar4 = "yes";
      if (local_48 == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-s      : creates a simple AIG (no renoding) [default = %s]\n",pcVar4);
      pcVar4 = "yes";
      if (fFactor == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-f      : creates a factor-cut network [default = %s]\n",pcVar4);
      if (local_44 == 0) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-c      : performs renoding to derive the CNF [default = %s]\n",pcVar6);
      pcVar4 = "\t-h      : print the command usage\n";
LAB_002200a5:
      Abc_Print(iVar5,pcVar4);
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandMulti( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk, * pNtkRes;
    int nThresh, nFaninMax, c;
    int fCnf;
    int fMulti;
    int fSimple;
    int fFactor;
    extern Abc_Ntk_t * Abc_NtkMulti( Abc_Ntk_t * pNtk, int nThresh, int nFaninMax, int fCnf, int fMulti, int fSimple, int fFactor );

    pNtk = Abc_FrameReadNtk(pAbc);

    // set defaults
    nThresh   =  1;
    nFaninMax = 20;
    fCnf      =  0;
    fMulti    =  1;
    fSimple   =  0;
    fFactor   =  0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "TFmcsfh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'T':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-T\" should be followed by an integer.\n" );
                goto usage;
            }
            nThresh = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nThresh < 0 )
                goto usage;
            break;
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            nFaninMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nFaninMax < 0 )
                goto usage;
            break;
        case 'c':
            fCnf ^= 1;
            break;
        case 'm':
            fMulti ^= 1;
            break;
        case 's':
            fSimple ^= 1;
            break;
        case 'f':
            fFactor ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( !Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( -1, "Cannot renode a network that is not an AIG (run \"strash\").\n" );
        return 1;
    }

    // get the new network
    pNtkRes = Abc_NtkMulti( pNtk, nThresh, nFaninMax, fCnf, fMulti, fSimple, fFactor );
    if ( pNtkRes == NULL )
    {
        Abc_Print( -1, "Renoding has failed.\n" );
        return 1;
    }
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    return 0;

usage:
    Abc_Print( -2, "usage: multi [-TF <num>] [-msfch]\n" );
    Abc_Print( -2, "\t          transforms an AIG into a logic network by creating larger nodes\n" );
    Abc_Print( -2, "\t-F <num>: the maximum fanin size after renoding [default = %d]\n", nFaninMax );
    Abc_Print( -2, "\t-T <num>: the threshold for AIG node duplication [default = %d]\n", nThresh );
    Abc_Print( -2, "\t          (an AIG node is the root of a new node after renoding\n" );
    Abc_Print( -2, "\t          if this leads to duplication of no more than %d AIG nodes,\n", nThresh );
    Abc_Print( -2, "\t          that is, if [(numFanouts(Node)-1) * size(MFFC(Node))] <= %d)\n", nThresh );
    Abc_Print( -2, "\t-m      : creates multi-input AND graph [default = %s]\n", fMulti? "yes": "no" );
    Abc_Print( -2, "\t-s      : creates a simple AIG (no renoding) [default = %s]\n", fSimple? "yes": "no" );
    Abc_Print( -2, "\t-f      : creates a factor-cut network [default = %s]\n", fFactor? "yes": "no" );
    Abc_Print( -2, "\t-c      : performs renoding to derive the CNF [default = %s]\n", fCnf? "yes": "no" );
    Abc_Print( -2, "\t-h      : print the command usage\n");
    return 1;
}